

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcStructuralSurfaceMemberVarying::~IfcStructuralSurfaceMemberVarying
          (IfcStructuralSurfaceMemberVarying *this,void **vtt)

{
  void **vtt_local;
  IfcStructuralSurfaceMemberVarying *this_local;
  
  *(void **)&(this->super_IfcStructuralSurfaceMember).super_IfcStructuralMember.
             super_IfcStructuralItem.super_IfcProduct.super_IfcObject = *vtt;
  *(void **)(&(this->super_IfcStructuralSurfaceMember).super_IfcStructuralMember.
              super_IfcStructuralItem.super_IfcProduct.super_IfcObject.field_0x0 +
            *(long *)(*(long *)&(this->super_IfcStructuralSurfaceMember).super_IfcStructuralMember.
                                super_IfcStructuralItem.super_IfcProduct.super_IfcObject + -0x18)) =
       vtt[0x34];
  *(void **)&(this->super_IfcStructuralSurfaceMember).super_IfcStructuralMember.
             super_IfcStructuralItem.super_IfcProduct.super_IfcObject.field_0x88 = vtt[0x35];
  (this->super_IfcStructuralSurfaceMember).super_IfcStructuralMember.super_IfcStructuralItem.
  super_IfcProduct.super_IfcObject.super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>.
  _vptr_ObjectHelper = (_func_int **)vtt[0x36];
  *(void **)&(this->super_IfcStructuralSurfaceMember).super_IfcStructuralMember.
             super_IfcStructuralItem.super_IfcProduct.super_IfcObject.field_0xd0 = vtt[0x37];
  *(void **)&(this->super_IfcStructuralSurfaceMember).super_IfcStructuralMember.
             super_IfcStructuralItem.super_IfcProduct.field_0x100 = vtt[0x38];
  *(void **)&(this->super_IfcStructuralSurfaceMember).super_IfcStructuralMember.
             super_IfcStructuralItem.super_IfcProduct.field_0x110 = vtt[0x39];
  *(void **)&(this->super_IfcStructuralSurfaceMember).super_IfcStructuralMember.
             super_IfcStructuralItem.field_0x120 = vtt[0x3a];
  *(void **)&(this->super_IfcStructuralSurfaceMember).field_0x160 = vtt[0x3b];
  STEP::ListOf<Assimp::STEP::EXPRESS::PrimitiveDataType<double>,_2UL,_0UL>::~ListOf
            ((ListOf<Assimp::STEP::EXPRESS::PrimitiveDataType<double>,_2UL,_0UL> *)
             &(this->super_IfcStructuralSurfaceMember).field_0x170);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcStructuralSurfaceMemberVarying,_2UL>::~ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcStructuralSurfaceMemberVarying,_2UL> *)
             &(this->super_IfcStructuralSurfaceMember).field_0x160,vtt + 0x32);
  IfcStructuralSurfaceMember::~IfcStructuralSurfaceMember
            (&this->super_IfcStructuralSurfaceMember,vtt + 1);
  return;
}

Assistant:

IfcStructuralSurfaceMemberVarying() : Object("IfcStructuralSurfaceMemberVarying") {}